

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_video.cpp
# Opt level: O0

void __thiscall FPaletteTester::FPaletteTester(FPaletteTester *this)

{
  FPaletteTester *this_local;
  
  FTexture::FTexture(&this->super_FTexture,(char *)0x0,-1);
  (this->super_FTexture)._vptr_FTexture = (_func_int **)&PTR__FPaletteTester_00b6edd0;
  (this->super_FTexture).Width = 0x10;
  (this->super_FTexture).Height = 0x10;
  (this->super_FTexture).WidthBits = '\x04';
  (this->super_FTexture).HeightBits = '\x04';
  (this->super_FTexture).WidthMask = 0xf;
  this->CurTranslation = 0;
  this->WantTranslation = 1;
  MakeTexture(this);
  return;
}

Assistant:

FPaletteTester::FPaletteTester()
{
	Width = 16;
	Height = 16;
	WidthBits = 4;
	HeightBits = 4;
	WidthMask = 15;
	CurTranslation = 0;
	WantTranslation = 1;
	MakeTexture();
}